

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O0

void amrex::EB_WriteSingleLevelPlotfile
               (string *plotfilename,MultiFab *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Geometry *geom,Real time,int level_step,string *versionName,
               string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> ref_ratio;
  Vector<int,_std::allocator<int>_> level_steps;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> geomarr;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> mfarr;
  Vector<int,_std::allocator<int>_> *in_stack_000004a0;
  Real in_stack_000004a8;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_000004b0;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000004b8;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *in_stack_000004c0;
  int in_stack_000004cc;
  string *in_stack_000004d0;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_00000500;
  string *in_stack_00000508;
  string *in_stack_00000510;
  string *in_stack_00000518;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000520;
  allocator_type *in_stack_fffffffffffffee8;
  value_type *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_ffffffffffffff00;
  
  std::allocator<const_amrex::MultiFab_*>::allocator
            ((allocator<const_amrex::MultiFab_*> *)0x104cffa);
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (value_type *)in_stack_fffffffffffffef0,(allocator_type *)in_stack_fffffffffffffee8);
  std::allocator<const_amrex::MultiFab_*>::~allocator
            ((allocator<const_amrex::MultiFab_*> *)0x104d028);
  std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x104d047);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (allocator_type *)in_stack_fffffffffffffee8);
  std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x104d072);
  std::allocator<int>::allocator((allocator<int> *)0x104d081);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8,(value_type *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  std::allocator<int>::~allocator((allocator<int> *)0x104d0a9);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x104d0b8);
  EB_WriteMultiLevelPlotfile
            (in_stack_000004d0,in_stack_000004cc,in_stack_000004c0,in_stack_000004b8,
             in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000500,
             in_stack_00000508,in_stack_00000510,in_stack_00000518,in_stack_00000520);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x104d137);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x104d141);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x104d14e);
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
            ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x104d15b)
  ;
  return;
}

Assistant:

void
EB_WriteSingleLevelPlotfile (const std::string& plotfilename,
                             const MultiFab& mf, const Vector<std::string>& varnames,
                             const Geometry& geom, Real time, int level_step,
                             const std::string &versionName,
                             const std::string &levelPrefix,
                             const std::string &mfPrefix,
                             const Vector<std::string>& extra_dirs)
{
    Vector<const MultiFab*> mfarr(1,&mf);
    Vector<Geometry> geomarr(1,geom);
    Vector<int> level_steps(1,level_step);
    Vector<IntVect> ref_ratio;

    EB_WriteMultiLevelPlotfile(plotfilename, 1, mfarr, varnames, geomarr, time,
                               level_steps, ref_ratio, versionName, levelPrefix, mfPrefix, extra_dirs);
}